

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_filehandle.cc
# Opt level: O0

RC __thiscall
PF_FileHandle::GetThisPage(PF_FileHandle *this,PageNum pageNum,PF_PageHandle *pageHandle)

{
  int iVar1;
  int *local_38;
  char *pPageBuf;
  PF_PageHandle *pPStack_28;
  int rc;
  PF_PageHandle *pageHandle_local;
  PF_FileHandle *pPStack_18;
  PageNum pageNum_local;
  PF_FileHandle *this_local;
  
  if (this->bFileOpen == 0) {
    this_local._4_4_ = 5;
  }
  else {
    pPStack_28 = pageHandle;
    pageHandle_local._4_4_ = pageNum;
    pPStack_18 = this;
    iVar1 = IsValidPageNum(this,pageNum);
    if (iVar1 == 0) {
      this_local._4_4_ = 3;
    }
    else {
      pPageBuf._4_4_ =
           PF_BufferMgr::GetPage
                     (this->pBufferMgr,this->unixfd,pageHandle_local._4_4_,(char **)&local_38,1);
      this_local._4_4_ = pPageBuf._4_4_;
      if (pPageBuf._4_4_ == 0) {
        if (*local_38 == -2) {
          pPStack_28->pageNum = pageHandle_local._4_4_;
          pPStack_28->pPageData = (char *)(local_38 + 1);
          this_local._4_4_ = 0;
        }
        else {
          this_local._4_4_ = UnpinPage(this,pageHandle_local._4_4_);
          if (this_local._4_4_ == 0) {
            this_local._4_4_ = 3;
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

RC PF_FileHandle::GetThisPage(PageNum pageNum, PF_PageHandle &pageHandle) const
{
   int  rc;               // return code
   char *pPageBuf;        // address of page in buffer pool

   // File must be open
   if (!bFileOpen)
      return (PF_CLOSEDFILE);

   // Validate page number
   if (!IsValidPageNum(pageNum))
      return (PF_INVALIDPAGE);

   // Get this page from the buffer manager
   if ((rc = pBufferMgr->GetPage(unixfd, pageNum, &pPageBuf)))
      return (rc);

   // If the page is valid, then set pageHandle to this page and return ok
   if (((PF_PageHdr*)pPageBuf)->nextFree == PF_PAGE_USED) {

      // Set the pageHandle local variables
      pageHandle.pageNum = pageNum;
      pageHandle.pPageData = pPageBuf + sizeof(PF_PageHdr);

      // Return ok
      return (0);
   }

   // If the page is *not* a valid one, then unpin the page
   if ((rc = UnpinPage(pageNum)))
      return (rc);

   return (PF_INVALIDPAGE);
}